

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

void init_dungeons(void)

{
  dungeon *__dest;
  d_level *pdVar1;
  ulong uVar2;
  boolean bVar3;
  xchar xVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  dlb *dp;
  size_t sVar12;
  branch *pbVar13;
  s_level *psVar14;
  dlb *pdVar15;
  dlb *in_RCX;
  undefined7 uVar16;
  xchar xVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  tmplevel *__src;
  tmpbranch *ptVar22;
  char *__s1;
  s_level **ppsVar23;
  ulong uVar24;
  long lVar25;
  s_level **ppsVar26;
  s_level **ppsVar27;
  s_level *psVar28;
  s_level *psVar29;
  branch *pbVar30;
  int iVar31;
  long lVar32;
  level_map *plVar33;
  s_level **ppsVar34;
  s_level **ppsVar35;
  int iVar36;
  s_level **ppsVar37;
  bool bVar38;
  char cVar39;
  char tbuf [256];
  version_info vers_info;
  branch *local_1618;
  long local_1610;
  undefined8 local_1608;
  s_level *local_1600 [32];
  version_info local_14fc;
  proto_dungeon local_14f0;
  
  local_14f0.n_levs = 0;
  local_14f0.n_brs = 0;
  dp = dlb_fopen("dungeon","r");
  if (dp == (dlb *)0x0) {
    sprintf((char *)&local_1608,"Cannot open dungeon description - \"%s","dungeon");
    sVar12 = strlen((char *)&local_1608);
    *(undefined8 *)((long)local_1600 + (sVar12 - 8)) = 0x206d6f72662022;
    sVar12 = strlen((char *)&local_1608);
    *(undefined2 *)((long)local_1600 + (sVar12 - 8)) = 0x220a;
    *(undefined1 *)((long)local_1600 + (sVar12 - 6)) = 0;
    if (fqn_prefix[1] != (char *)0x0) {
      strcat((char *)&local_1608,fqn_prefix[1]);
    }
    sVar12 = strlen((char *)&local_1608);
    *(undefined4 *)((long)local_1600 + (sVar12 - 8)) = 0x6164686e;
    *(undefined2 *)((long)local_1600 + (sVar12 - 4)) = 0x74;
    sVar12 = strlen((char *)&local_1608);
    *(undefined8 *)((long)local_1600 + (sVar12 - 8)) = 0x21656c69662022;
    panic((char *)&local_1608);
  }
  iVar11 = (int)dp;
  Fread(&local_14fc,0xc,iVar11,in_RCX);
  bVar3 = check_version(&local_14fc,"dungeon",'\x01');
  if (bVar3 == '\0') {
    panic("Dungeon description not valid.");
  }
  sp_levchn = (s_level *)0x0;
  Fread(&n_dgns,4,iVar11,in_RCX);
  if (0xf < n_dgns) {
    panic("init_dungeons: too many dungeons");
  }
  memset(dungeons,0,0x380);
  if (0 < n_dgns) {
    iVar19 = 0;
    lVar25 = 0;
    lVar32 = 0;
    do {
      lVar20 = (long)iVar19;
      local_1610 = lVar20 * 0x4c;
      Fread(local_14f0.tmpdungeon + lVar20,0x4c,iVar11,in_RCX);
      iVar31 = (int)lVar32;
      iVar36 = (int)lVar25;
      if ((flags.debug == '\0') && (iVar8 = local_14f0.tmpdungeon[lVar20].chance, iVar8 != 0)) {
        uVar7 = mt_random();
        in_RCX = (dlb *)(ulong)((uVar7 / 100) * 100);
        if ((int)(uVar7 % 100) < iVar8) goto LAB_0018b0ef;
        if (0 < local_14f0.tmpdungeon[lVar20].levels) {
          iVar8 = 0;
          do {
            Fread(local_14f0.tmplevel + iVar31,0x30,iVar11,in_RCX);
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_14f0.tmpdungeon[lVar20].levels);
        }
        if (0 < local_14f0.tmpdungeon[lVar20].branches) {
          in_RCX = (dlb *)local_14f0.tmpbranch;
          ptVar22 = (tmpbranch *)in_RCX + iVar36;
          iVar36 = 0;
          do {
            Fread(ptVar22,0x28,iVar11,in_RCX);
            iVar36 = iVar36 + 1;
          } while (iVar36 < local_14f0.tmpdungeon[lVar20].branches);
        }
        n_dgns = n_dgns + -1;
        iVar19 = iVar19 + -1;
      }
      else {
LAB_0018b0ef:
        __dest = dungeons + lVar20;
        strcpy(__dest->dname,local_14f0.tmpdungeon[lVar20].name);
        strcpy(dungeons[lVar20].proto,local_14f0.tmpdungeon[lVar20].protoname);
        dungeons[lVar20].boneid = local_14f0.tmpdungeon[lVar20].boneschar;
        lVar21 = (long)local_14f0.tmpdungeon[lVar20].lev.rand;
        if (lVar21 == 0) {
          xVar17 = (xchar)local_14f0.tmpdungeon[lVar20].lev.base;
        }
        else {
          uVar7 = mt_random();
          xVar17 = SUB161(ZEXT416(uVar7) % SEXT816(lVar21),0) +
                   (char)local_14f0.tmpdungeon[lVar20].lev.base;
        }
        dungeons[lVar20].num_dunlevs = xVar17;
        if (iVar19 == 0) {
          dungeons[lVar20].ledger_start = 0;
          uVar16 = (undefined7)((ulong)in_RCX >> 8);
          iVar8 = 1;
          lVar21 = 0x34;
        }
        else {
          iVar8 = (int)dungeons[iVar19 + -1].num_dunlevs + dungeons[iVar19 + -1].ledger_start;
          lVar21 = 0x30;
          uVar16 = 0;
        }
        *(int *)(__dest->dname + lVar21) = iVar8;
        *(bool *)(lVar20 * 0x38 + 0x31ce1e) = iVar19 == 0;
        pdVar15 = (dlb *)(CONCAT71(uVar16,*(undefined1 *)&dungeons[lVar20].flags) &
                         0xffffffffffffff81);
        *(byte *)&dungeons[lVar20].flags =
             (byte)local_14f0.tmpdungeon[lVar20].flags & 0x7e | (byte)pdVar15;
        iVar8 = local_14f0.tmpdungeon[lVar20].entry_lev;
        cVar39 = (char)iVar8;
        if (iVar8 < 0) {
          bVar6 = cVar39 + dungeons[lVar20].num_dunlevs;
          cVar39 = bVar6 + 1;
          pdVar15 = (dlb *)0x1;
          if (0x7e < bVar6) {
            cVar39 = '\x01';
          }
          dungeons[lVar20].entry_lev = cVar39;
        }
        else if (iVar8 == 0) {
          dungeons[lVar20].entry_lev = '\x01';
        }
        else {
          pdVar15 = (dlb *)(ulong)(uint)(int)cVar39;
          if ((int)dungeons[lVar20].num_dunlevs < (int)cVar39) {
            cVar39 = dungeons[lVar20].num_dunlevs;
          }
          dungeons[lVar20].entry_lev = cVar39;
        }
        if (iVar19 != 0) {
          xVar17 = dungeons[lVar20].entry_lev;
          iVar9 = find_branch(__dest->dname,&local_14f0);
          pbVar13 = (branch *)malloc(0x18);
          pbVar13->next = (branch *)0x0;
          pbVar13->id = 0;
          pbVar13->type = 0;
          (pbVar13->end1).dnum = '\0';
          (pbVar13->end1).dlevel = '\0';
          (pbVar13->end2).dnum = '\0';
          (pbVar13->end2).dlevel = '\0';
          pbVar13->end1_up = '\0';
          *(undefined3 *)&pbVar13->field_0x15 = 0;
          iVar8 = branch_id + 1;
          pbVar13->id = branch_id;
          branch_id = iVar8;
          iVar8 = local_14f0.tmpbranch[iVar9].type;
          switch(iVar8) {
          case 0:
          case 3:
            break;
          case 1:
            iVar8 = (local_14f0.tmpbranch[iVar9].up == 0) + 1;
            break;
          case 2:
            iVar8 = 2 - (uint)(local_14f0.tmpbranch[iVar9].up == 0);
            break;
          default:
            iVar8 = 0;
            impossible("correct_branch_type: unknown branch type");
          }
          pbVar13->type = iVar8;
          xVar4 = parent_dnum(__dest->dname,&local_14f0);
          (pbVar13->end1).dnum = xVar4;
          local_1618 = pbVar13;
          xVar4 = parent_dnum(__dest->dname,&local_14f0);
          iVar8 = find_branch(__dest->dname,&local_14f0);
          iVar10 = level_range(xVar4,(int)local_14f0.tmpbranch[iVar8].lev.base,
                               (int)local_14f0.tmpbranch[iVar8].lev.rand,
                               local_14f0.tmpbranch[iVar8].chain,&local_14f0,(int *)&local_1608);
          uVar7 = mt_random();
          pbVar13 = local_1618;
          iVar18 = SUB164(ZEXT416(uVar7) % SEXT816((long)iVar10),0);
          iVar8 = iVar18;
          do {
            iVar8 = iVar8 + 1;
            if (iVar10 <= iVar8) {
              iVar8 = 0;
            }
            bVar38 = branches != (branch *)0x0;
            if (branches != (branch *)0x0) {
              bVar38 = true;
              pbVar30 = branches;
              do {
                if ((((pbVar30->end1).dnum == xVar4) &&
                    (iVar8 + (int)local_1608 == (int)(pbVar30->end1).dlevel)) ||
                   (((pbVar30->end2).dnum == xVar4 &&
                    (iVar8 + (int)local_1608 == (int)(pbVar30->end2).dlevel)))) break;
                pbVar30 = pbVar30->next;
                bVar38 = pbVar30 != (branch *)0x0;
              } while (bVar38);
            }
          } while ((bVar38) && (iVar8 != iVar18));
          (local_1618->end1).dlevel = (char)iVar8 + (char)local_1608;
          (local_1618->end2).dnum = (xchar)iVar19;
          iVar8 = local_14f0.tmpbranch[iVar9].up;
          (local_1618->end2).dlevel = xVar17;
          local_1618->end1_up = iVar8 != 0;
          insert_branch(local_1618,'\0');
          iVar8 = (int)(pbVar13->end1).dnum;
          if (iVar19 == iVar8) {
            cVar5 = (char)dungeons[(pbVar13->end2).dnum].depth_start + (pbVar13->end2).dlevel;
            cVar39 = pbVar13->end1_up == '\0';
          }
          else {
            cVar5 = (char)dungeons[iVar8].depth_start + (pbVar13->end1).dlevel;
            cVar39 = pbVar13->end1_up;
          }
          uVar7 = -(uint)(cVar39 != '\0') | 1;
          if (pbVar13->type == 3) {
            uVar7 = 0;
          }
          uVar7 = ((uVar7 + (int)(char)(cVar5 + -1)) - (int)dungeons[lVar20].entry_lev) + 1;
          pdVar15 = (dlb *)(ulong)uVar7;
          dungeons[lVar20].depth_start = uVar7;
        }
        if (' ' < dungeons[lVar20].num_dunlevs) {
          dungeons[lVar20].num_dunlevs = ' ';
        }
        local_14f0.start = local_14f0.n_levs;
        local_14f0.n_levs = local_14f0.n_levs + local_14f0.tmpdungeon[lVar20].levels;
        if (0x32 < local_14f0.n_levs) {
          panic("init_dungeon: too many special levels");
        }
        if (iVar31 < local_14f0.n_levs) {
          lVar21 = local_1610 + 0x1c;
          lVar32 = (long)iVar31;
          __src = local_14f0.tmplevel + lVar32;
          do {
            Fread(__src,0x30,iVar11,pdVar15);
            local_14f0.final_lev[lVar32] = (s_level *)0x0;
            if (flags.debug == '\0') {
              iVar31 = __src->chance;
              uVar7 = mt_random();
              pdVar15 = (dlb *)(ulong)((uVar7 / 100) * 100);
              if ((int)(uVar7 % 100) < iVar31) goto LAB_0018b591;
            }
            else {
LAB_0018b591:
              psVar14 = (s_level *)malloc(0x20);
              local_14f0.final_lev[lVar32] = psVar14;
              psVar14->next = (s_level *)0x0;
              (psVar14->dlevel).dnum = '\0';
              (psVar14->dlevel).dlevel = '\0';
              psVar14->proto[0] = '\0';
              psVar14->proto[1] = '\0';
              psVar14->proto[2] = '\0';
              psVar14->proto[3] = '\0';
              psVar14->proto[4] = '\0';
              psVar14->proto[5] = '\0';
              psVar14->proto[6] = '\0';
              psVar14->proto[7] = '\0';
              psVar14->proto[8] = '\0';
              psVar14->proto[9] = '\0';
              psVar14->proto[10] = '\0';
              psVar14->proto[0xb] = '\0';
              psVar14->proto[0xc] = '\0';
              psVar14->proto[0xd] = '\0';
              *(undefined8 *)(psVar14->proto + 0xe) = 0;
              strcpy(psVar14->proto,__src->name);
              psVar14->boneid = __src->boneschar;
              (psVar14->dlevel).dnum = (xchar)iVar19;
              (psVar14->dlevel).dlevel = '\0';
              uVar7 = __src->flags;
              pdVar15 = (dlb *)(ulong)uVar7;
              bVar6 = (byte)uVar7 & 0xf | *(byte *)&psVar14->flags & 0x80;
              *(byte *)&psVar14->flags = (byte)uVar7 & 0x70 | bVar6;
              if ((uVar7 & 0x70) == 0) {
                uVar24 = (ulong)CONCAT31((int3)(uVar7 >> 8),
                                         local_14f0.tmpdungeon[0].protoname[lVar21]) &
                         0xffffffffffffff70;
                bVar6 = (byte)uVar24 | bVar6;
                pdVar15 = (dlb *)CONCAT71((int7)(uVar24 >> 8),bVar6);
                *(byte *)&psVar14->flags = bVar6;
              }
              psVar14->rndlevs = (uchar)__src->rndlevs;
              psVar14->next = (s_level *)0x0;
            }
            lVar32 = lVar32 + 1;
            __src = __src + 1;
          } while (lVar32 < local_14f0.n_levs);
        }
        bVar3 = place_level(local_14f0.start,&local_14f0);
        if (bVar3 == '\0') {
          panic("init_dungeon:  couldn\'t place levels");
        }
        in_RCX = (dlb *)(long)local_14f0.n_levs;
        pdVar15 = (dlb *)(long)local_14f0.start;
        if (local_14f0.start < local_14f0.n_levs) {
          do {
            psVar14 = local_14f0.final_lev[(long)pdVar15];
            if (psVar14 != (s_level *)0x0) {
              if (sp_levchn == (s_level *)0x0) {
                ppsVar27 = &((s_level *)0x0)->next;
                psVar29 = sp_levchn;
              }
              else {
                ppsVar27 = &((s_level *)0x0)->next;
                psVar28 = sp_levchn;
                do {
                  if (((psVar28->dlevel).dnum == (psVar14->dlevel).dnum) &&
                     (psVar29 = psVar28, (psVar14->dlevel).dlevel < (psVar28->dlevel).dlevel))
                  break;
                  psVar29 = psVar28->next;
                  ppsVar27 = &psVar28->next;
                  psVar28 = psVar29;
                } while (psVar29 != (s_level *)0x0);
              }
              if ((s_level *)ppsVar27 == (s_level *)0x0) {
                ppsVar27 = &sp_levchn;
                psVar29 = sp_levchn;
              }
              psVar14->next = psVar29;
              ((s_level *)ppsVar27)->next = psVar14;
            }
            pdVar15 = (dlb *)((long)&pdVar15->fp + 1);
          } while (pdVar15 != in_RCX);
          local_14f0.start = (int)pdVar15;
        }
        local_14f0.n_brs = local_14f0.n_brs + local_14f0.tmpdungeon[lVar20].branches;
        if (0x20 < local_14f0.n_brs) {
          panic("init_dungeon: too many branches");
        }
        if (iVar36 < local_14f0.n_brs) {
          lVar25 = (long)iVar36;
          in_RCX = (dlb *)local_14f0.tmpbranch;
          ptVar22 = (tmpbranch *)in_RCX + lVar25;
          do {
            Fread(ptVar22,0x28,iVar11,in_RCX);
            lVar25 = lVar25 + 1;
            ptVar22 = ptVar22 + 1;
          } while (lVar25 < local_14f0.n_brs);
        }
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < n_dgns);
  }
  dlb_fclose(dp);
  lVar25 = 0;
  do {
    uVar7 = mt_random();
    tune[lVar25] = (char)(uVar7 / 7) * -7 + (char)uVar7 + 'A';
    lVar25 = lVar25 + 1;
  } while (lVar25 != 5);
  tune[5] = '\0';
  plVar33 = level_map;
  __s1 = "advcal";
LAB_0018b7df:
  iVar11 = strncmp(__s1,"rogue",6);
  if ((iVar11 != 0) || (flags.rogue_enabled != '\0')) {
    ppsVar27 = &sp_levchn;
    do {
      ppsVar27 = &((s_level *)ppsVar27)->next->next;
      if ((s_level *)ppsVar27 == (s_level *)0x0) goto LAB_0018b803;
      iVar11 = strncasecmp(__s1,((s_level *)ppsVar27)->proto,0xffffffffffffffff);
    } while (iVar11 != 0);
    if ((s_level *)ppsVar27 == (s_level *)0x0) goto LAB_0018b803;
    pdVar1 = plVar33->lev_spec;
    pdVar1->dnum = (((s_level *)ppsVar27)->dlevel).dnum;
    pdVar1->dlevel = (((s_level *)ppsVar27)->dlevel).dlevel;
    iVar11 = strncmp(__s1,"x-",2);
    if (iVar11 == 0) {
      sprintf(((s_level *)ppsVar27)->proto,"%s%s",urole.filecode);
      goto LAB_0018b803;
    }
    pbVar13 = branches;
    if (pdVar1 == &dungeon_topology.d_knox_level) {
      for (; pbVar13 != (branch *)0x0; pbVar13 = pbVar13->next) {
        if (((pbVar13->end2).dnum == dungeon_topology.d_knox_level.dnum) &&
           ((pbVar13->end2).dlevel == dungeon_topology.d_knox_level.dlevel)) goto LAB_0018b91f;
      }
    }
    else {
      if (pdVar1 != &dungeon_topology.d_advcal_level) goto LAB_0018b803;
      for (; pbVar13 != (branch *)0x0; pbVar13 = pbVar13->next) {
        if (((pbVar13->end2).dnum == dungeon_topology.d_advcal_level.dnum) &&
           ((pbVar13->end2).dlevel == dungeon_topology.d_advcal_level.dlevel)) goto LAB_0018b91f;
      }
    }
    goto LAB_0018b92b;
  }
  goto LAB_0018b803;
LAB_0018b91f:
  (pbVar13->end1).dnum = (xchar)n_dgns;
LAB_0018b92b:
  insert_branch(pbVar13,'\x01');
LAB_0018b803:
  __s1 = plVar33[1].lev_name;
  plVar33 = plVar33 + 1;
  if (*__s1 == '\0') goto LAB_0018b93a;
  goto LAB_0018b7df;
LAB_0018b93a:
  if (flags.rogue_enabled == '\0') {
    ppsVar27 = &sp_levchn;
    psVar14 = (s_level *)0x0;
    do {
      ppsVar37 = &psVar14->next;
      ppsVar27 = &((s_level *)ppsVar27)->next->next;
      if ((s_level *)ppsVar27 == (s_level *)0x0) goto LAB_0018b98f;
      iVar11 = strncmp(((s_level *)ppsVar27)->proto,"rogue",6);
      psVar14 = (s_level *)ppsVar27;
    } while (iVar11 != 0);
    if ((s_level *)ppsVar37 == (s_level *)0x0) {
      ppsVar37 = &sp_levchn;
    }
    ((s_level *)ppsVar37)->next = ((s_level *)ppsVar27)->next;
  }
LAB_0018b98f:
  dungeon_topology.d_quest_dnum = dname_to_dnum("The Quest",'\0');
  dungeon_topology.d_sokoban_dnum = dname_to_dnum("Sokoban",'\0');
  dungeon_topology.d_mines_dnum = dname_to_dnum("The Gnomish Mines",'\0');
  dungeon_topology.d_tower_dnum = dname_to_dnum("Vlad\'s Tower",'\0');
  dungeon_topology.d_mall_dnum = dname_to_dnum("Town",'\0');
  dungeon_topology.d_dragon_dnum = dname_to_dnum("The Dragon Caves",'\x01');
  ppsVar27 = &sp_levchn;
  do {
    ppsVar27 = &((s_level *)ppsVar27)->next->next;
    if ((s_level *)ppsVar27 == (s_level *)0x0) goto LAB_0018ba67;
    iVar11 = strncasecmp("dummy",((s_level *)ppsVar27)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  if ((s_level *)ppsVar27 != (s_level *)0x0) {
    cVar39 = (((s_level *)ppsVar27)->dlevel).dnum;
    if (1 - dungeons[cVar39].depth_start < (int)dungeons[cVar39].num_dunlevs) {
      dungeons[cVar39].depth_start = dungeons[cVar39].depth_start + -1;
    }
  }
LAB_0018ba67:
  ppsVar27 = &sp_levchn;
  do {
    ppsVar27 = &((s_level *)ppsVar27)->next->next;
    if ((s_level *)ppsVar27 == (s_level *)0x0) break;
    iVar11 = strncasecmp("dummy",((s_level *)ppsVar27)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  ppsVar37 = &sp_levchn;
  do {
    ppsVar37 = &((s_level *)ppsVar37)->next->next;
    if ((s_level *)ppsVar37 == (s_level *)0x0) break;
    iVar11 = strncasecmp("earth",((s_level *)ppsVar37)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  ppsVar34 = &sp_levchn;
  do {
    ppsVar34 = &((s_level *)ppsVar34)->next->next;
    if ((s_level *)ppsVar34 == (s_level *)0x0) break;
    iVar11 = strncasecmp("air",((s_level *)ppsVar34)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  ppsVar35 = &sp_levchn;
  do {
    ppsVar35 = &((s_level *)ppsVar35)->next->next;
    if ((s_level *)ppsVar35 == (s_level *)0x0) break;
    iVar11 = strncasecmp("fire",((s_level *)ppsVar35)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  ppsVar23 = &sp_levchn;
  do {
    ppsVar23 = &((s_level *)ppsVar23)->next->next;
    if ((s_level *)ppsVar23 == (s_level *)0x0) break;
    iVar11 = strncasecmp("water",((s_level *)ppsVar23)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  ppsVar26 = &sp_levchn;
  do {
    ppsVar26 = &((s_level *)ppsVar26)->next->next;
    if ((s_level *)ppsVar26 == (s_level *)0x0) break;
    iVar11 = strncasecmp("astral",((s_level *)ppsVar26)->proto,0xffffffffffffffff);
  } while (iVar11 != 0);
  uVar24 = 4;
  local_1608 = (s_level *)ppsVar23;
  local_1600[0] = (s_level *)ppsVar35;
  local_1600[1] = (s_level *)ppsVar34;
  local_1600[2] = (s_level *)ppsVar37;
  do {
    uVar7 = mt_random();
    uVar2 = (ulong)uVar7 % (uVar24 & 0xffffffff);
    psVar14 = local_1600[uVar2 - 1];
    local_1600[uVar2 - 1] = (s_level *)(&local_1610)[uVar24];
    (&local_1610)[uVar24] = (long)psVar14;
    uVar24 = uVar24 - 1;
  } while (1 < uVar24);
  ((s_level *)ppsVar26)->next = local_1600[2];
  uVar24 = 4;
  do {
    *(branch **)(&local_1610)[uVar24] = (&local_1618)[uVar24];
    uVar24 = uVar24 - 1;
  } while (1 < uVar24);
  local_1608->next = (s_level *)ppsVar27;
  return;
}

Assistant:

void init_dungeons(void)	/* initialize the "dungeon" structs */
{
	dlb	*dgn_file;
	int i, cl = 0, cb = 0;
	s_level *x;
	struct proto_dungeon pd;
	const struct level_map *lev_map;
	struct version_info vers_info;

	pd.n_levs = pd.n_brs = 0;

	dgn_file = dlb_fopen(DUNGEON_FILE, RDBMODE);
	if (!dgn_file) {
	    char tbuf[BUFSZ];
	    sprintf(tbuf, "Cannot open dungeon description - \"%s",
		DUNGEON_FILE);
	    strcat(tbuf, "\" from ");
	    strcat(tbuf, "\n\"");
	    if (fqn_prefix[DATAPREFIX]) strcat(tbuf, fqn_prefix[DATAPREFIX]);
	    strcat(tbuf, DLBFILE);
	    strcat(tbuf, "\" file!");
	    panic(tbuf);
	}

	/* validate the data's version against the program's version */
	Fread(&vers_info, sizeof vers_info, 1, dgn_file);
	
	if (!check_version(&vers_info, DUNGEON_FILE, TRUE))
	    panic("Dungeon description not valid.");

	/*
	 * Read in each dungeon and transfer the results to the internal
	 * dungeon arrays.
	 */
	sp_levchn = NULL;
	Fread(&n_dgns, sizeof(int), 1, dgn_file);
	if (n_dgns >= MAXDUNGEON)
	    panic("init_dungeons: too many dungeons");

	/*
	 * Zero-out dungeons to prevent replay desyncs, specifically the data
	 * beyond the ends of each dungeon's name/protoname fields.
	 */
	memset(dungeons, 0, MAXDUNGEON * sizeof(dungeon));

	for (i = 0; i < n_dgns; i++) {
	    Fread(&pd.tmpdungeon[i], sizeof(struct tmpdungeon), 1, dgn_file);
	    if (!wizard)
	      if (pd.tmpdungeon[i].chance && (pd.tmpdungeon[i].chance <= rn2(100))) {
		int j;

		/* skip over any levels or branches */
		for (j = 0; j < pd.tmpdungeon[i].levels; j++)
		    Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);

		for (j = 0; j < pd.tmpdungeon[i].branches; j++)
		    Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
		n_dgns--; i--;
		continue;
	      }

	    strcpy(dungeons[i].dname, pd.tmpdungeon[i].name);
	    strcpy(dungeons[i].proto, pd.tmpdungeon[i].protoname);
	    dungeons[i].boneid = pd.tmpdungeon[i].boneschar;

	    if (pd.tmpdungeon[i].lev.rand)
		dungeons[i].num_dunlevs = (xchar)rn1(pd.tmpdungeon[i].lev.rand,
						     pd.tmpdungeon[i].lev.base);
	    else dungeons[i].num_dunlevs = (xchar)pd.tmpdungeon[i].lev.base;

	    if (!i) {
		dungeons[i].ledger_start = 0;
		dungeons[i].depth_start = 1;
		dungeons[i].dunlev_ureached = 1;
	    } else {
		dungeons[i].ledger_start = dungeons[i-1].ledger_start +
					      dungeons[i-1].num_dunlevs;
		dungeons[i].dunlev_ureached = 0;
	    }

	    dungeons[i].flags.hellish = !!(pd.tmpdungeon[i].flags & HELLISH);
	    dungeons[i].flags.maze_like = !!(pd.tmpdungeon[i].flags & MAZELIKE);
	    dungeons[i].flags.rogue_like = !!(pd.tmpdungeon[i].flags & ROGUELIKE);
	    dungeons[i].flags.align = ((pd.tmpdungeon[i].flags & D_ALIGN_MASK) >> 4);
	    /*
	     * Set the entry level for this dungeon.  The pd.tmpdungeon entry
	     * value means:
	     *		< 0	from bottom (-1 == bottom level)
	     *		  0	default (top)
	     *		> 0	actual level (1 = top)
	     *
	     * Note that the entry_lev field in the dungeon structure is
	     * redundant.  It is used only here and in print_dungeon().
	     */
	    if (pd.tmpdungeon[i].entry_lev < 0) {
		dungeons[i].entry_lev = dungeons[i].num_dunlevs +
						pd.tmpdungeon[i].entry_lev + 1;
		if (dungeons[i].entry_lev <= 0) dungeons[i].entry_lev = 1;
	    } else if (pd.tmpdungeon[i].entry_lev > 0) {
		dungeons[i].entry_lev = pd.tmpdungeon[i].entry_lev;
		if (dungeons[i].entry_lev > dungeons[i].num_dunlevs)
		    dungeons[i].entry_lev = dungeons[i].num_dunlevs;
	    } else { /* default */
		dungeons[i].entry_lev = 1;	/* defaults to top level */
	    }

	    if (i) {	/* set depth */
		branch *br;
		schar from_depth;
		boolean from_up;

		br = add_branch(i, dungeons[i].entry_lev, &pd);

		/* Get the depth of the connecting end. */
		if (br->end1.dnum == i) {
		    from_depth = depth(&br->end2);
		    from_up = !br->end1_up;
		} else {
		    from_depth = depth(&br->end1);
		    from_up = br->end1_up;
		}

		/*
		 * Calculate the depth of the top of the dungeon via
		 * its branch.  First, the depth of the entry point:
		 *
		 *	depth of branch from "parent" dungeon
		 *	+ -1 or 1 depending on a up or down stair or
		 *	  0 if portal
		 *
		 * Followed by the depth of the top of the dungeon:
		 *
		 *	- (entry depth - 1)
		 *
		 * We'll say that portals stay on the same depth.
		 */
		dungeons[i].depth_start = from_depth
					+ (br->type == BR_PORTAL ? 0 :
							(from_up ? -1 : 1))
					- (dungeons[i].entry_lev - 1);
	    }

	    /* this is redundant - it should have been flagged by dgn_comp */
	    if (dungeons[i].num_dunlevs > MAXLEVEL)
		dungeons[i].num_dunlevs = MAXLEVEL;

	    pd.start = pd.n_levs;	/* save starting point */
	    pd.n_levs += pd.tmpdungeon[i].levels;
	    if (pd.n_levs > LEV_LIMIT)
		panic("init_dungeon: too many special levels");
	    
	    /*
	     * Read in the prototype special levels.  Don't add generated
	     * special levels until they are all placed.
	     */
	    for (; cl < pd.n_levs; cl++) {
		Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);
		init_level(i, cl, &pd);
	    }
	    
	    /*
	     * Recursively place the generated levels for this dungeon.  This
	     * routine will attempt all possible combinations before giving
	     * up.
	     */
	    if (!place_level(pd.start, &pd))
		panic("init_dungeon:  couldn't place levels");

	    for (; pd.start < pd.n_levs; pd.start++)
		if (pd.final_lev[pd.start]) add_level(pd.final_lev[pd.start]);


	    pd.n_brs += pd.tmpdungeon[i].branches;
	    if (pd.n_brs > BRANCH_LIMIT)
		panic("init_dungeon: too many branches");
	    for (; cb < pd.n_brs; cb++)
		Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
	}
	dlb_fclose(dgn_file);

	for (i = 0; i < 5; i++) tune[i] = 'A' + rn2(7);
	tune[5] = 0;

	/*
	 * Find most of the special levels and dungeons so we can access their
	 * locations quickly.
	 */
	for (lev_map = level_map; lev_map->lev_name[0]; lev_map++) {
		/* 
		 * suppress finding the rogue level if it is not enabled
		 * this makes Is_rogue_level(x) fail
		 */
		if (!strncmp(lev_map->lev_name, "rogue", 6) &&
		    !flags.rogue_enabled)
		    continue;
		
		x = find_level(lev_map->lev_name);
		if (x) {
			assign_level(lev_map->lev_spec, &x->dlevel);
			if (!strncmp(lev_map->lev_name, "x-", 2)) {
				/* This is where the name substitution on the
				 * levels of the quest dungeon occur.
				 */
				sprintf(x->proto, "%s%s", urole.filecode, &lev_map->lev_name[1]);
			} else if (lev_map->lev_spec == &knox_level) {
				branch *br;
				/*
				 * Kludge to allow floating Knox entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &knox_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			} else if (lev_map->lev_spec == &advcal_level) {
				branch *br;
				/*
				 * Kludge to allow floating advcal entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &advcal_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			}
		}
	}
	
	if (!flags.rogue_enabled) {
	    /* 
	     * remove rogue level from the special level chain
	     * This makes Is_special(x) return NULL, so the level will never be
	     * instantiated
	     */
	    s_level *s_curr, *s_prev;
	    s_prev = NULL;
	    for (s_curr = sp_levchn; s_curr; s_curr = s_curr->next) {
		if (!strncmp(s_curr->proto, "rogue", 6)) {
		    if (s_prev)
			s_prev->next = s_curr->next;
		    else
			sp_levchn = s_curr->next;
		    
		    break;
		}
		s_prev = s_curr;
	    }
	}

/*
 *	I hate hardwiring these names. :-(
 */
	quest_dnum = dname_to_dnum("The Quest", FALSE);
	sokoban_dnum = dname_to_dnum("Sokoban", FALSE);
	mines_dnum = dname_to_dnum("The Gnomish Mines", FALSE);
	tower_dnum = dname_to_dnum("Vlad's Tower", FALSE);
	mall_dnum = dname_to_dnum("Town", FALSE);
	dragon_dnum = dname_to_dnum("The Dragon Caves", TRUE);

	/* one special fixup for dummy surface level */
	if ((x = find_level("dummy")) != 0) {
	    i = x->dlevel.dnum;
	    /* the code above puts earth one level above dungeon level #1,
	       making the dummy level overlay level 1; but the whole reason
	       for having the dummy level is to make earth have depth -1
	       instead of 0, so adjust the start point to shift endgame up */
	    if (dunlevs_in_dungeon(&x->dlevel) > 1 - dungeons[i].depth_start)
		dungeons[i].depth_start -= 1;
	    /* TO DO: strip "dummy" out all the way here,
	       so that it's hidden from <ctrl/O> feedback. */
	}

	shuffle_planes();
}